

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRImageFromMemory(EXRImage *exr_image,EXRHeader *exr_header,uchar *memory,char **err)

{
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uchar *marker;
  uchar *head;
  char **in_stack_00000048;
  uchar *in_stack_00000050;
  uchar *in_stack_00000058;
  EXRHeader *in_stack_00000060;
  EXRImage *in_stack_00000068;
  int local_4;
  
  if ((in_RDI == 0) || (in_RDX == 0)) {
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = "Invalid argument.";
    }
    local_4 = -3;
  }
  else if (*(int *)(in_RSI + 0x58) == 0) {
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = "EXRHeader is not initialized.";
    }
    local_4 = -3;
  }
  else {
    local_4 = tinyexr::DecodeEXRImage
                        (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                         in_stack_00000048);
  }
  return local_4;
}

Assistant:

int LoadEXRImageFromMemory(EXRImage *exr_image, const EXRHeader *exr_header,
                           const unsigned char *memory, const char **err) {
  if (exr_image == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->header_len == 0) {
    if (err) {
      (*err) = "EXRHeader is not initialized.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const unsigned char *head = memory;
  const unsigned char *marker = reinterpret_cast<const unsigned char *>(
      memory + exr_header->header_len +
      8);  // +8 for magic number + version header.
  return tinyexr::DecodeEXRImage(exr_image, exr_header, head, marker, err);
}